

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathArcToFast
          (ImDrawList *this,ImVec2 *centre,float radius,int a_min_of_12,int a_max_of_12)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ImVec2 *pIVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  int i;
  int iVar8;
  long lVar9;
  int a;
  float fVar10;
  float fVar11;
  
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx == '\0') {
    PathArcToFast();
  }
  if (PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds == '\0') {
    lVar9 = 0;
    do {
      fVar10 = (float)(int)lVar9 / 12.0;
      fVar10 = (fVar10 + fVar10) * 3.1415927;
      fVar11 = cosf(fVar10);
      PathArcToFast::circle_vtx[lVar9].x = fVar11;
      fVar10 = sinf(fVar10);
      PathArcToFast::circle_vtx[lVar9].y = fVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0xc);
    PathArcToFast(ImVec2_const&,float,int,int)::circle_vtx_builds = '\x01';
  }
  iVar7 = (this->_Path).Size;
  if (radius == 0.0 || a_max_of_12 < a_min_of_12) {
    iVar3 = (this->_Path).Capacity;
    if (iVar7 == iVar3) {
      if (iVar3 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar3 / 2 + iVar3;
      }
      iVar8 = iVar7 + 1;
      if (iVar7 + 1 < iVar6) {
        iVar8 = iVar6;
      }
      if (iVar3 < iVar8) {
        pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar8 << 3);
        pIVar4 = (this->_Path).Data;
        if (pIVar4 != (ImVec2 *)0x0) {
          memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
        }
        ImGui::MemFree((this->_Path).Data);
        (this->_Path).Data = pIVar5;
        (this->_Path).Capacity = iVar8;
      }
    }
    iVar7 = (this->_Path).Size;
    (this->_Path).Size = iVar7 + 1;
    (this->_Path).Data[iVar7] = *centre;
  }
  else {
    iVar7 = (a_max_of_12 - a_min_of_12) + iVar7 + 1;
    if ((this->_Path).Capacity < iVar7) {
      pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
      pIVar4 = (this->_Path).Data;
      if (pIVar4 != (ImVec2 *)0x0) {
        memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
      }
      ImGui::MemFree((this->_Path).Data);
      (this->_Path).Data = pIVar5;
      (this->_Path).Capacity = iVar7;
    }
    if (a_min_of_12 <= a_max_of_12) {
      do {
        iVar7 = a_min_of_12 +
                (((uint)(a_min_of_12 / 6 + (a_min_of_12 >> 0x1f)) >> 1) - (a_min_of_12 >> 0x1f)) *
                -0xc;
        fVar10 = PathArcToFast::circle_vtx[iVar7].x;
        fVar11 = centre->x;
        fVar1 = PathArcToFast::circle_vtx[iVar7].y;
        fVar2 = centre->y;
        iVar7 = (this->_Path).Size;
        iVar3 = (this->_Path).Capacity;
        if (iVar7 == iVar3) {
          if (iVar3 == 0) {
            iVar6 = 8;
          }
          else {
            iVar6 = iVar3 / 2 + iVar3;
          }
          iVar7 = iVar7 + 1;
          if (iVar7 < iVar6) {
            iVar7 = iVar6;
          }
          if (iVar3 < iVar7) {
            pIVar5 = (ImVec2 *)ImGui::MemAlloc((long)iVar7 << 3);
            pIVar4 = (this->_Path).Data;
            if (pIVar4 != (ImVec2 *)0x0) {
              memcpy(pIVar5,pIVar4,(long)(this->_Path).Size << 3);
            }
            ImGui::MemFree((this->_Path).Data);
            (this->_Path).Data = pIVar5;
            (this->_Path).Capacity = iVar7;
          }
        }
        pIVar4 = (this->_Path).Data;
        iVar7 = (this->_Path).Size;
        (this->_Path).Size = iVar7 + 1;
        pIVar4[iVar7].x = fVar10 * radius + fVar11;
        pIVar4[iVar7].y = fVar1 * radius + fVar2;
        a_min_of_12 = a_min_of_12 + 1;
      } while (a_max_of_12 + 1 != a_min_of_12);
    }
  }
  return;
}

Assistant:

void ImDrawList::PathArcToFast(const ImVec2& centre, float radius, int a_min_of_12, int a_max_of_12)
{
    static ImVec2 circle_vtx[12];
    static bool circle_vtx_builds = false;
    const int circle_vtx_count = IM_ARRAYSIZE(circle_vtx);
    if (!circle_vtx_builds)
    {
        for (int i = 0; i < circle_vtx_count; i++)
        {
            const float a = ((float)i / (float)circle_vtx_count) * 2*IM_PI;
            circle_vtx[i].x = cosf(a);
            circle_vtx[i].y = sinf(a);
        }
        circle_vtx_builds = true;
    }

    if (radius == 0.0f || a_min_of_12 > a_max_of_12)
    {
        _Path.push_back(centre);
        return;
    }
    _Path.reserve(_Path.Size + (a_max_of_12 - a_min_of_12 + 1));
    for (int a = a_min_of_12; a <= a_max_of_12; a++)
    {
        const ImVec2& c = circle_vtx[a % circle_vtx_count];
        _Path.push_back(ImVec2(centre.x + c.x * radius, centre.y + c.y * radius));
    }
}